

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraph::MultiTransformNode::calculateStatistics
          (MultiTransformNode *this,Statistics *stat)

{
  size_t sVar1;
  Node *pNVar2;
  ulong uVar3;
  long lVar4;
  
  sVar1 = (this->super_Node).indegree;
  (this->super_Node).indegree = sVar1 + 1;
  if (sVar1 != 0) {
    return;
  }
  (*(((this->child).ptr)->super_RefCount)._vptr_RefCount[9])();
  if ((this->spaces).
      super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->spaces).
      super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0x10;
    uVar3 = 0;
    do {
      stat->numTransformNodes = stat->numTransformNodes + 1;
      if (((this->child).ptr)->indegree == 1) {
        stat->numTransformedObjects = stat->numTransformedObjects + 1;
      }
      if (1 < *(ulong *)((long)&(((this->spaces).
                                  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->time_range).lower +
                        lVar4)) {
        pNVar2 = (this->child).ptr;
        (*(pNVar2->super_RefCount)._vptr_RefCount[9])(pNVar2,stat);
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x30;
    } while (uVar3 < (ulong)(((long)(this->spaces).
                                    super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->spaces).
                                    super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x5555555555555555));
  }
  return;
}

Assistant:

void SceneGraph::MultiTransformNode::calculateStatistics(Statistics& stat)
  {
    indegree++;
    if (indegree == 1)
    {
      child->calculateStatistics(stat);

      for (size_t i = 0; i < spaces.size(); ++i) {
        stat.numTransformNodes++;
        if (child->indegree == 1)
          stat.numTransformedObjects++;

        if (spaces[i].size() > 1) child->calculateStatistics(stat); // break instance up when motion blur is used
      }
    }
  }